

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall
el::base::TypedConfigurations::setValue<unsigned_long>
          (TypedConfigurations *this,Level level,unsigned_long *value,
          unordered_map<el::Level,_unsigned_long,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
          *confMap,bool includeGlobalLevel)

{
  __buckets_ptr pp_Var1;
  unordered_map<el::Level,unsigned_long,std::hash<el::Level>,std::equal_to<el::Level>,std::allocator<std::pair<el::Level_const,unsigned_long>>>
  *puVar2;
  bool bVar3;
  bool bVar4;
  pointer ppVar5;
  mapped_type *pmVar6;
  pair<el::Level,_unsigned_long> pVar7;
  pair<el::Level,_unsigned_long> local_90;
  _Node_iterator_base<std::pair<const_el::Level,_unsigned_long>,_true> local_80;
  _Node_iterator_base<std::pair<const_el::Level,_unsigned_long>,_true> local_78;
  _Node_iterator_base<std::pair<const_el::Level,_unsigned_long>,_true> local_70;
  key_type local_64;
  _Node_iterator_base<std::pair<const_el::Level,_unsigned_long>,_true> local_60;
  iterator it;
  Level local_44;
  pair<el::Level,_unsigned_long> local_40;
  byte local_29;
  unordered_map<el::Level,unsigned_long,std::hash<el::Level>,std::equal_to<el::Level>,std::allocator<std::pair<el::Level_const,unsigned_long>>>
  *puStack_28;
  bool includeGlobalLevel_local;
  unordered_map<el::Level,_unsigned_long,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
  *confMap_local;
  unsigned_long *value_local;
  TypedConfigurations *pTStack_10;
  Level level_local;
  TypedConfigurations *this_local;
  
  local_29 = includeGlobalLevel;
  puStack_28 = (unordered_map<el::Level,unsigned_long,std::hash<el::Level>,std::equal_to<el::Level>,std::allocator<std::pair<el::Level_const,unsigned_long>>>
                *)confMap;
  confMap_local =
       (unordered_map<el::Level,_unsigned_long,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
        *)value;
  value_local._4_4_ = level;
  pTStack_10 = this;
  bVar3 = utils::std::
          unordered_map<el::Level,_unsigned_long,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
          ::empty(confMap);
  puVar2 = puStack_28;
  if ((bVar3) && ((local_29 & 1) != 0)) {
    local_44 = Global;
    pVar7 = std::make_pair<el::Level,unsigned_long_const&>(&local_44,(unsigned_long *)confMap_local)
    ;
    local_40.second = pVar7.second;
    local_40.first = pVar7.first;
    std::
    unordered_map<el::Level,unsigned_long,std::hash<el::Level>,std::equal_to<el::Level>,std::allocator<std::pair<el::Level_const,unsigned_long>>>
    ::insert<std::pair<el::Level,unsigned_long>>(puVar2,&local_40);
  }
  else {
    local_64 = Global;
    local_60._M_cur =
         (__node_type *)
         utils::std::
         unordered_map<el::Level,_unsigned_long,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
         ::find((unordered_map<el::Level,_unsigned_long,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
                 *)puStack_28,&local_64);
    local_70._M_cur =
         (__node_type *)
         utils::std::
         unordered_map<el::Level,_unsigned_long,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
         ::end((unordered_map<el::Level,_unsigned_long,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
                *)puStack_28);
    bVar4 = utils::std::__detail::operator!=(&local_60,&local_70);
    bVar3 = false;
    if (bVar4) {
      ppVar5 = utils::std::__detail::
               _Node_iterator<std::pair<const_el::Level,_unsigned_long>,_false,_true>::operator->
                         ((_Node_iterator<std::pair<const_el::Level,_unsigned_long>,_false,_true> *)
                          &local_60);
      bVar3 = (__buckets_ptr)ppVar5->second == (confMap_local->_M_h)._M_buckets;
    }
    if (!bVar3) {
      local_78._M_cur =
           (__node_type *)
           utils::std::
           unordered_map<el::Level,_unsigned_long,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
           ::find((unordered_map<el::Level,_unsigned_long,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
                   *)puStack_28,(key_type *)((long)&value_local + 4));
      local_60._M_cur = local_78._M_cur;
      local_80._M_cur =
           (__node_type *)
           utils::std::
           unordered_map<el::Level,_unsigned_long,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
           ::end((unordered_map<el::Level,_unsigned_long,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
                  *)puStack_28);
      bVar3 = utils::std::__detail::operator==(&local_60,&local_80);
      puVar2 = puStack_28;
      if (bVar3) {
        pVar7 = std::make_pair<el::Level&,unsigned_long_const&>
                          ((Level *)((long)&value_local + 4),(unsigned_long *)confMap_local);
        local_90.second = pVar7.second;
        local_90.first = pVar7.first;
        std::
        unordered_map<el::Level,unsigned_long,std::hash<el::Level>,std::equal_to<el::Level>,std::allocator<std::pair<el::Level_const,unsigned_long>>>
        ::insert<std::pair<el::Level,unsigned_long>>(puVar2,&local_90);
      }
      else {
        pp_Var1 = (confMap_local->_M_h)._M_buckets;
        pmVar6 = utils::std::
                 unordered_map<el::Level,_unsigned_long,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
                 ::at((unordered_map<el::Level,_unsigned_long,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
                       *)puStack_28,(key_type *)((long)&value_local + 4));
        *pmVar6 = (mapped_type)pp_Var1;
      }
    }
  }
  return;
}

Assistant:

void setValue(Level level, const Conf_T& value, std::unordered_map<Level, Conf_T>* confMap,
                bool includeGlobalLevel = true) {
    // If map is empty and we are allowed to add into generic level (Level::Global), do it!
    if (confMap->empty() && includeGlobalLevel) {
      confMap->insert(std::make_pair(Level::Global, value));
      return;
    }
    // If same value exist in generic level already, dont add it to explicit level
    typename std::unordered_map<Level, Conf_T>::iterator it = confMap->find(Level::Global);
    if (it != confMap->end() && it->second == value) {
      return;
    }
    // Now make sure we dont double up values if we really need to add it to explicit level
    it = confMap->find(level);
    if (it == confMap->end()) {
      // Value not found for level, add new
      confMap->insert(std::make_pair(level, value));
    } else {
      // Value found, just update value
      confMap->at(level) = value;
    }
  }